

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bytedata.cpp
# Opt level: O0

void __thiscall ByteData_Serialize_Test::ByteData_Serialize_Test(ByteData_Serialize_Test *this)

{
  ByteData_Serialize_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__ByteData_Serialize_Test_009d9618;
  return;
}

Assistant:

TEST(ByteData, Serialize) {
  auto blank_str = [](uint16_t len){
    std::string ret;
    ret.reserve(len*2);
    ret.resize(len*2, '0');
    return ret;
  };

  // FIXME(fujita-cg):  32/64byte長については、capasityの限界によりテスト不可
  //                    capasityが解決したらテストを修正する
  const uint64_t vi_max8 = 252;
  const uint64_t vi_max16 = std::numeric_limits<uint16_t>::max();
  // const uint64_t vi_max32 = std::numeric_limits<uint32_t>::max();
  // const uint64_t vi_max64 = std::numeric_limits<uint64_t>::max();
  std::map<std::string, std::string> test_vector = {
    {"", "00"},
    {blank_str(1), "01" + blank_str(1)},
    {blank_str(vi_max8-1), ("fb" + blank_str(vi_max8-1))},
    {blank_str(vi_max8), ("fc" + blank_str(vi_max8))},
    {blank_str(vi_max8+1), ("fdfd00" + blank_str(vi_max8+1))},
    {blank_str(vi_max16-1), ("fdfeff" + blank_str(vi_max16-1))},
    {blank_str(vi_max16), ("fdffff" + blank_str(vi_max16))},
    // {blank_str(vi_max16+1), ("fe00000100" + blank_str(vi_max16+1))},
    // {blank_str(vi_max32-1), ("fefeffffff" + blank_str(vi_max32-1))},
    // {blank_str(vi_max32), ("feffffffff" + blank_str(vi_max32))},
    // {blank_str(vi_max32+1), ("ff0000000001000000" + blank_str(vi_max32+1))},
    // {blank_str(vi_max64-1), ("fffeffffffffffffff" + blank_str(vi_max64-1))},
    // {blank_str(vi_max64), ("ffffffffffffffffff" + blank_str(vi_max64))},
  };

  ByteData serialized;
  ByteData data;
  decltype(test_vector)::const_iterator citr = test_vector.cbegin();
  while (citr != test_vector.cend()) {
    EXPECT_NO_THROW(data = ByteData(citr->first));
    EXPECT_NO_THROW(serialized = data.Serialize());
    EXPECT_STREQ(serialized.GetHex().c_str(), ByteData(citr->second).GetHex().c_str());
    EXPECT_EQ(data.GetSerializeSize(), serialized.GetDataSize());
    ++citr;
  }
}